

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

string * __thiscall
CoreML::dimensionsToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,vector<long,_std::allocator<long>_> *dims,
          bool useArrayFormat)

{
  char *pcVar1;
  size_t i;
  ulong uVar2;
  string separator;
  stringstream ss;
  allocator local_1d9;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar1 = anon_var_dwarf_3062b3;
  if ((int)dims != 0) {
    pcVar1 = ", ";
  }
  std::__cxx11::string::string(local_1d8,pcVar1,&local_1d9);
  if ((char)dims != '\0') {
    std::operator<<(local_1a8,"[");
  }
  for (uVar2 = 0; uVar2 < (ulong)(*(long *)(this + 8) - *(long *)this >> 3); uVar2 = uVar2 + 1) {
    std::ostream::_M_insert<long>((long)local_1a8);
    if (uVar2 < (*(long *)(this + 8) - *(long *)this >> 3) - 1U) {
      std::operator<<(local_1a8,local_1d8);
    }
  }
  if ((char)dims != '\0') {
    std::operator<<(local_1a8,"]");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

static std::string dimensionsToString(const std::vector<int64_t> &dims, bool useArrayFormat = false) {

        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " × ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i=0; i<dims.size(); i++) {
            ss << dims[i];
            if (i < dims.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }